

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMatcher.h
# Opt level: O2

bool __thiscall OrderMatcher::insert(OrderMatcher *this,Order *order)

{
  bool bVar1;
  iterator iVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>,_bool>
  pVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>
  local_1a0;
  Market local_d0;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>_>
                  *)this,&order->m_symbol);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->m_markets)._M_t._M_impl.super__Rb_tree_header) {
    memset(&local_d0,0,0xb0);
    Market::Market(&local_d0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>::
    pair<Market,_true>(&local_1a0,&order->m_symbol,&local_d0);
    pVar3 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Market>,std::_Select1st<std::pair<std::__cxx11::string_const,Market>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Market>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,Market>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Market>,std::_Select1st<std::pair<std::__cxx11::string_const,Market>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Market>>>
                        *)this,&local_1a0);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>::
    ~pair(&local_1a0);
    Market::~Market(&local_d0);
  }
  bVar1 = Market::insert((Market *)(iVar2._M_node + 2),order);
  return bVar1;
}

Assistant:

bool insert( const Order& order )
  {
    Markets::iterator i = m_markets.find( order.getSymbol() );
    if ( i == m_markets.end() )
      i = m_markets.insert( std::make_pair( order.getSymbol(), Market() ) ).first;
    return i->second.insert( order );
  }